

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

sexp_conflict sexp_get_host_name_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  char *__name;
  sexp_conflict psVar2;
  uint uVar3;
  size_t __len;
  sexp_gc_var_t local_140;
  sexp_conflict local_130;
  char buf0 [256];
  
  local_140.var = &local_130;
  local_130 = (sexp_conflict)0x43e;
  local_140.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_140;
  __name = buf0;
  __len = 0x100;
  do {
    uVar3 = (uint)__len;
    iVar1 = gethostname(__name,__len);
    if (iVar1 == 0) {
      psVar2 = (sexp_conflict)sexp_c_string(ctx,__name,0xffffffffffffffff);
      if (uVar3 != 0x100) {
LAB_00102cf5:
        free(__name);
      }
      (ctx->value).context.saves = local_140.next;
      return psVar2;
    }
    if (0xa00000 < uVar3) {
      psVar2 = (sexp_conflict)
               sexp_user_exception(ctx,self,"exceeded max auto-expand len in get-host-name",0x23e);
      goto LAB_00102cf5;
    }
    if (uVar3 != 0x100) {
      free(__name);
    }
    __len = (size_t)(uVar3 * 2);
    __name = (char *)calloc(__len,1);
  } while( true );
}

Assistant:

sexp sexp_get_host_name_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int err = 0;
  char buf0[256];
  int len0;
  char *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  len0 = 256;
  tmp0 = buf0;
 loop:
  err = gethostname(tmp0, len0);
  if (err) {
  if (len0 > 10485760) {
    res = sexp_user_exception(ctx, self, "exceeded max auto-expand len in get-host-name", SEXP_NULL);
} else {
  if (len0 != 256)
    free(tmp0);
  len0 *= 2;
  tmp0 = (char*) calloc(len0, sizeof(tmp0[0]));
  goto loop;
}
  } else {
  res0 = sexp_c_string(ctx, tmp0, -1);
  res = res0;
  }
  if (len0 != 256)
    free(tmp0);
  sexp_gc_release1(ctx);
  return res;
}